

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManCutMatch(Nf_Man_t *p,int iObj)

{
  undefined1 *puVar1;
  Nf_Obj_t *pNVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  Nf_Cfg_t NVar8;
  uint uVar9;
  Nf_Obj_t *pNVar10;
  float *pfVar11;
  int *piVar12;
  uint *puVar13;
  uint uVar14;
  Nf_Mat_t (*paNVar15) [2];
  byte bVar16;
  uint uVar17;
  uint *pCutSet;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  uint *pCut;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  
  if (iObj < 0) {
LAB_0077e137:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar26 = (ulong)(uint)iObj;
  uVar14 = iObj * 2;
  iVar6 = (p->vFlowRefs).nSize;
  if ((iVar6 <= (int)uVar14) || (uVar22 = uVar14 | 1, iVar6 <= (int)uVar22)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
  }
  if ((p->vCutSets).nSize <= iObj) {
LAB_0077e118:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar7 = (p->vCutSets).pArray[uVar26];
  uVar17 = (int)uVar7 >> 0x10;
  if (((int)uVar17 < 0) || ((p->vPages).nSize <= (int)uVar17)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pNVar10 = p->pNfObjs;
  pNVar2 = pNVar10 + iObj;
  pfVar11 = (p->vFlowRefs).pArray;
  uVar25 = (ulong)uVar14;
  fVar4 = pfVar11[uVar25];
  fVar5 = pfVar11[uVar22];
  pCutSet = (uint *)((ulong)((uVar7 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar17]);
  if (p->Iter == 0) {
    iVar6 = 0;
    iVar18 = 0;
  }
  else {
    lVar21 = 0;
    do {
      lVar3 = lVar21 + uVar25;
      iVar6 = (p->vRequired).nSize;
      if (iVar6 <= (int)lVar3) goto LAB_0077e118;
      piVar12 = (p->vRequired).pArray;
      if (piVar12[lVar3] == 0x3fffffff) {
        uVar7 = *(uint *)pNVar2->M[lVar21];
        uVar17 = uVar7 >> 0x14 & 0x3ff;
        if (uVar17 == 0) {
          __assert_fail("h > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x94,"int *Nf_CutFromHandle(int *, int)");
        }
        if ((pCutSet[uVar17] & 0x1f) == 0) {
          iVar19 = 0;
          iVar18 = 0;
        }
        else {
          NVar8 = pNVar2->M[lVar21][0].Cfg;
          bVar16 = 0;
          uVar27 = 0;
          iVar18 = 0;
          iVar19 = 0;
          do {
            uVar9 = pCutSet[(ulong)uVar17 + (ulong)(((uint)NVar8 >> 8) >> (bVar16 & 0x1f) & 0xf) + 1
                           ];
            if ((long)(int)uVar9 == 0) break;
            bVar28 = (((uint)NVar8 >> 1 & 0x7f) >> ((uint)uVar27 & 0x1f) & 1) != 0;
            if ((int)uVar9 < 0) goto LAB_0077e137;
            uVar24 = (uint)bVar28 + uVar9 * 2;
            if (iVar6 <= (int)uVar24) goto LAB_0077e118;
            iVar23 = *(int *)((long)p->pCells->iDelays +
                             uVar27 * 4 + (ulong)((uVar7 & 0xfffff) * 0x50));
            iVar20 = pNVar10[(int)uVar9].M[bVar28][0].D + iVar23;
            if (iVar19 <= iVar20) {
              iVar19 = iVar20;
            }
            iVar23 = iVar23 + piVar12[uVar24];
            if (iVar23 < iVar18) {
              iVar23 = iVar18;
            }
            if (piVar12[uVar24] < 0x3fffffff) {
              iVar18 = iVar23;
            }
            uVar27 = uVar27 + 1;
            bVar16 = bVar16 + 4;
          } while (((ulong)pCutSet[uVar17] & 0x1f) != uVar27);
        }
        iVar18 = p->InvDelayI * p->pPars->nReqTimeFlex + iVar18;
        if (iVar18 <= iVar19) {
          iVar18 = iVar19;
        }
        piVar12[lVar3] = iVar18;
      }
      bVar28 = lVar21 == 0;
      lVar21 = lVar21 + 1;
    } while (bVar28);
    iVar6 = (p->vRequired).nSize;
    if ((iVar6 <= (int)uVar14) || (iVar6 <= (int)uVar22)) goto LAB_0077e118;
    iVar6 = piVar12[uVar25];
    iVar18 = piVar12[uVar22];
  }
  *(undefined8 *)pNVar2->M[0] = 0;
  pNVar2->M[0][0].D = 0;
  pNVar2->M[0][0].F = 0.0;
  *(undefined8 *)pNVar2->M[1] = 0;
  pNVar2->M[1][0].D = 0;
  pNVar2->M[1][0].F = 0.0;
  *(undefined8 *)(pNVar2->M[0] + 1) = 0;
  pNVar2->M[0][1].D = 0;
  pNVar2->M[0][1].F = 0.0;
  *(undefined8 *)(pNVar2->M[1] + 1) = 0;
  pNVar2->M[1][1].D = 0;
  pNVar2->M[1][1].F = 0.0;
  pNVar2->M[0][0].D = 0x3fffffff;
  pNVar2->M[0][0].F = 3.4028235e+38;
  pNVar2->M[1][0].D = 0x3fffffff;
  pNVar2->M[1][0].F = 3.4028235e+38;
  pNVar2->M[0][1].D = 0x3fffffff;
  pNVar2->M[0][1].F = 3.4028235e+38;
  pNVar2->M[1][1].D = 0x3fffffff;
  pNVar2->M[1][1].F = 3.4028235e+38;
  if (0 < (int)*pCutSet) {
    iVar19 = 0;
    puVar13 = pCutSet;
    do {
      pCut = puVar13 + 1;
      if ((int)(*pCut >> 6) < p->vTt2Match->nSize) {
        uVar14 = *pCut & 0x1f;
        if ((uVar14 == 1) && (puVar13[2] == iObj)) {
          __assert_fail("!Nf_CutIsTriv(pCut, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x4fa,"void Nf_ManCutMatch(Nf_Man_t *, int)");
        }
        if (p->pPars->nLutSize < (int)uVar14) {
          __assert_fail("Nf_CutSize(pCut) <= p->pPars->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x4fb,"void Nf_ManCutMatch(Nf_Man_t *, int)");
        }
        Nf_ManCutMatchOne(p,iObj,(int *)pCut,(int *)pCutSet);
      }
      iVar19 = iVar19 + 1;
      puVar13 = pCut + (*pCut & 0x1f);
    } while (iVar19 < (int)*pCutSet);
  }
  pNVar2->M[0][0].F = pNVar2->M[0][0].F / fVar4;
  pNVar2->M[0][1].F = pNVar2->M[0][1].F / fVar4;
  pNVar2->M[1][0].F = pNVar2->M[1][0].F / fVar5;
  pNVar2->M[1][1].F = pNVar2->M[1][1].F / fVar5;
  iVar19 = pNVar2->M[0][0].D;
  if ((0x3ffffffe < iVar19) && (0x3ffffffe < pNVar2->M[1][0].D)) {
    __assert_fail("pDp->D < SCL_INFINITY || pDn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x512,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  paNVar15 = pNVar10[iObj].M + 1;
  iVar23 = pNVar2->M[1][0].D;
  if (p->InvDelayI + iVar23 < iVar19) {
    NVar8 = ((Nf_Mat_t *)((long)paNVar15 + 0))->Cfg;
    iVar19 = pNVar10[iObj].M[1][0].D;
    fVar4 = pNVar10[iObj].M[1][0].F;
    *(undefined4 *)&pNVar2->M[0][0].field_0x0 =
         *(undefined4 *)&((Nf_Mat_t *)((long)paNVar15 + 0))->field_0x0;
    pNVar2->M[0][0].Cfg = NVar8;
    pNVar2->M[0][0].D = iVar19;
    pNVar2->M[0][0].F = fVar4;
    piVar12 = &pNVar2->M[0][0].D;
    *piVar12 = *piVar12 + p->InvDelayI;
    pNVar2->M[0][0].F = p->InvAreaF + pNVar2->M[0][0].F;
    puVar1 = &pNVar2->M[0][0].field_0x3;
    *puVar1 = *puVar1 | 0x40;
    if (pNVar2->M[0][1].D == 0x3fffffff) {
      NVar8 = pNVar2->M[0][0].Cfg;
      iVar19 = pNVar2->M[0][0].D;
      fVar4 = pNVar2->M[0][0].F;
      *(undefined4 *)&pNVar10[iObj].M[0][1].field_0x0 = *(undefined4 *)&pNVar2->M[0][0].field_0x0;
      pNVar10[iObj].M[0][1].Cfg = NVar8;
      pNVar10[iObj].M[0][1].D = iVar19;
      pNVar10[iObj].M[0][1].F = fVar4;
    }
  }
  else if (p->InvDelayI + iVar19 < iVar23) {
    NVar8 = pNVar2->M[0][0].Cfg;
    iVar19 = pNVar2->M[0][0].D;
    fVar4 = pNVar2->M[0][0].F;
    *(undefined4 *)&((Nf_Mat_t *)((long)paNVar15 + 0))->field_0x0 =
         *(undefined4 *)&pNVar2->M[0][0].field_0x0;
    ((Nf_Mat_t *)((long)paNVar15 + 0))->Cfg = NVar8;
    pNVar10[iObj].M[1][0].D = iVar19;
    pNVar10[iObj].M[1][0].F = fVar4;
    piVar12 = &pNVar2->M[1][0].D;
    *piVar12 = *piVar12 + p->InvDelayI;
    pNVar2->M[1][0].F = p->InvAreaF + pNVar2->M[1][0].F;
    puVar1 = &pNVar2->M[1][0].field_0x3;
    *puVar1 = *puVar1 | 0x40;
    if (pNVar2->M[1][1].D == 0x3fffffff) {
      NVar8 = ((Nf_Mat_t *)((long)paNVar15 + 0))->Cfg;
      iVar19 = pNVar10[iObj].M[1][0].D;
      fVar4 = pNVar10[iObj].M[1][0].F;
      *(undefined4 *)&pNVar10[iObj].M[1][1].field_0x0 =
           *(undefined4 *)&((Nf_Mat_t *)((long)paNVar15 + 0))->field_0x0;
      pNVar10[iObj].M[1][1].Cfg = NVar8;
      pNVar10[iObj].M[1][1].D = iVar19;
      pNVar10[iObj].M[1][1].F = fVar4;
    }
  }
  iVar19 = pNVar2->M[0][1].D;
  if (iVar19 != 0x3fffffff) {
    fVar4 = pNVar2->M[0][1].F;
    fVar5 = pNVar2->M[1][1].F;
    if ((fVar4 <= fVar5 + p->InvAreaF + 0.001) || (iVar6 < p->InvDelayI + pNVar2->M[1][1].D)) {
      if ((pNVar2->M[1][1].D == 0x3fffffff) ||
         ((fVar4 + p->InvAreaF + 0.001 < fVar5 && (iVar19 + p->InvDelayI <= iVar18)))) {
        if (p->Iter < 1) {
          __assert_fail("p->Iter > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x537,"void Nf_ManCutMatch(Nf_Man_t *, int)");
        }
        NVar8 = pNVar10[iObj].M[0][1].Cfg;
        iVar6 = pNVar10[iObj].M[0][1].D;
        fVar4 = pNVar10[iObj].M[0][1].F;
        *(undefined4 *)&pNVar10[iObj].M[1][1].field_0x0 =
             *(undefined4 *)&pNVar10[iObj].M[0][1].field_0x0;
        pNVar10[iObj].M[1][1].Cfg = NVar8;
        pNVar10[iObj].M[1][1].D = iVar6;
        pNVar10[iObj].M[1][1].F = fVar4;
        piVar12 = &pNVar2->M[1][1].D;
        *piVar12 = *piVar12 + p->InvDelayI;
        pNVar2->M[1][1].F = p->InvAreaF + pNVar2->M[1][1].F;
        puVar1 = &pNVar2->M[1][1].field_0x3;
        *puVar1 = *puVar1 | 0x40;
        if (pNVar2->M[1][0].D == 0x3fffffff) {
          NVar8 = pNVar10[iObj].M[1][1].Cfg;
          iVar6 = pNVar10[iObj].M[1][1].D;
          fVar4 = pNVar10[iObj].M[1][1].F;
          *(undefined4 *)*paNVar15 = *(undefined4 *)(pNVar10[iObj].M[1] + 1);
          pNVar10[iObj].M[1][0].Cfg = NVar8;
          pNVar10[iObj].M[1][0].D = iVar6;
          pNVar10[iObj].M[1][0].F = fVar4;
        }
      }
      goto LAB_0077e031;
    }
  }
  if (p->Iter < 1) {
    __assert_fail("p->Iter > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x52b,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  NVar8 = pNVar10[iObj].M[1][1].Cfg;
  iVar6 = pNVar10[iObj].M[1][1].D;
  fVar4 = pNVar10[iObj].M[1][1].F;
  *(undefined4 *)&pNVar10[iObj].M[0][1].field_0x0 = *(undefined4 *)&pNVar10[iObj].M[1][1].field_0x0;
  pNVar10[iObj].M[0][1].Cfg = NVar8;
  pNVar10[iObj].M[0][1].D = iVar6;
  pNVar10[iObj].M[0][1].F = fVar4;
  piVar12 = &pNVar2->M[0][1].D;
  *piVar12 = *piVar12 + p->InvDelayI;
  pNVar2->M[0][1].F = p->InvAreaF + pNVar2->M[0][1].F;
  puVar1 = &pNVar2->M[0][1].field_0x3;
  *puVar1 = *puVar1 | 0x40;
  if (pNVar2->M[0][0].D == 0x3fffffff) {
    NVar8 = pNVar10[iObj].M[0][1].Cfg;
    iVar6 = pNVar10[iObj].M[0][1].D;
    fVar4 = pNVar10[iObj].M[0][1].F;
    *(undefined4 *)pNVar2->M[0] = *(undefined4 *)(pNVar10[iObj].M[0] + 1);
    pNVar2->M[0][0].Cfg = NVar8;
    pNVar2->M[0][0].D = iVar6;
    pNVar2->M[0][0].F = fVar4;
  }
LAB_0077e031:
  if (pNVar2->M[0][0].D == 0x3fffffff) {
    printf("Object %d has pDp unassigned.\n",uVar26);
  }
  if (pNVar2->M[1][0].D == 0x3fffffff) {
    printf("Object %d has pDn unassigned.\n",uVar26);
  }
  if (pNVar2->M[0][1].D == 0x3fffffff) {
    printf("Object %d has pAp unassigned.\n",uVar26);
  }
  if (pNVar2->M[1][1].D == 0x3fffffff) {
    printf("Object %d has pAn unassigned.\n",uVar26);
  }
  if (0x3ffffffe < pNVar2->M[0][0].D) {
    __assert_fail("pDp->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x54f,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < pNVar2->M[1][0].D) {
    __assert_fail("pDn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x550,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < pNVar2->M[0][1].D) {
    __assert_fail("pAp->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x551,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < pNVar2->M[1][1].D) {
    __assert_fail("pAn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x552,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar11 = &pNVar2->M[0][0].F;
  if (3.4028235e+38 < *pfVar11 || *pfVar11 == 3.4028235e+38) {
    __assert_fail("pDp->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x554,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar11 = &pNVar2->M[1][0].F;
  if (3.4028235e+38 < *pfVar11 || *pfVar11 == 3.4028235e+38) {
    __assert_fail("pDn->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x555,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar11 = &pNVar2->M[0][1].F;
  if (3.4028235e+38 < *pfVar11 || *pfVar11 == 3.4028235e+38) {
    __assert_fail("pAp->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x556,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar11 = &pNVar2->M[1][1].F;
  if (3.4028235e+38 < *pfVar11 || *pfVar11 == 3.4028235e+38) {
    __assert_fail("pAn->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x557,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  return;
}

Assistant:

void Nf_ManCutMatch( Nf_Man_t * p, int iObj )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    Nf_Mat_t * pDp = &pBest->M[0][0];
    Nf_Mat_t * pDn = &pBest->M[1][0];
    Nf_Mat_t * pAp = &pBest->M[0][1];
    Nf_Mat_t * pAn = &pBest->M[1][1];
    float FlowRefPf  = Nf_ObjFlowRefs(p, iObj, 0);
    float FlowRefNf  = Nf_ObjFlowRefs(p, iObj, 1);
    int i, * pCut, * pCutSet = Nf_ObjCutSet( p, iObj );
    int Required[2] = {0};
    if ( p->Iter )
    {
        Nf_ObjComputeRequired( p, iObj );
        Required[0] = Nf_ObjRequired( p, iObj, 0 );
        Required[1] = Nf_ObjRequired( p, iObj, 1 );
    }
    memset( pBest, 0, sizeof(Nf_Obj_t) );
    pDp->D = SCL_INFINITY; pDp->F = FLT_MAX;
    pDn->D = SCL_INFINITY; pDn->F = FLT_MAX;
    pAp->D = SCL_INFINITY; pAp->F = FLT_MAX;
    pAn->D = SCL_INFINITY; pAn->F = FLT_MAX;
    Nf_SetForEachCut( pCutSet, pCut, i )
    {
        if ( Abc_Lit2Var(Nf_CutFunc(pCut)) >= Vec_WecSize(p->vTt2Match) )
            continue;
        assert( !Nf_CutIsTriv(pCut, iObj) );
        assert( Nf_CutSize(pCut) <= p->pPars->nLutSize );
        assert( Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match) );
        Nf_ManCutMatchOne( p, iObj, pCut, pCutSet );
    }

/*
    if ( 461 == iObj && p->Iter == 0 )
    {
        printf( "\nObj %6d (%.2f %.2f):\n", iObj, Scl_Int2Flt(Required[0]), Scl_Int2Flt(Required[1]) );
        Nf_ManCutMatchPrint( p, iObj, "Dp", &pBest->M[0][0] );
        Nf_ManCutMatchPrint( p, iObj, "Dn", &pBest->M[1][0] );
        Nf_ManCutMatchPrint( p, iObj, "Ap", &pBest->M[0][1] );
        Nf_ManCutMatchPrint( p, iObj, "An", &pBest->M[1][1] );
        printf( "\n" );
    }
*/
    // divide by ref count
    pDp->F = pDp->F / FlowRefPf;
    pAp->F = pAp->F / FlowRefPf;
    pDn->F = pDn->F / FlowRefNf;
    pAn->F = pAn->F / FlowRefNf;

    // add the inverters
    assert( pDp->D < SCL_INFINITY || pDn->D < SCL_INFINITY );
    if ( pDp->D > pDn->D + p->InvDelayI )
    {
        *pDp = *pDn;
        pDp->D += p->InvDelayI;
        pDp->F += p->InvAreaF;
        pDp->fCompl = 1;
        if ( pAp->D == SCL_INFINITY )
            *pAp = *pDp;
        //printf( "Using inverter to improve delay at node %d in phase %d.\n", iObj, 1 );
    }
    else if ( pDn->D > pDp->D + p->InvDelayI )
    {
        *pDn = *pDp;
        pDn->D += p->InvDelayI;
        pDn->F += p->InvAreaF;
        pDn->fCompl = 1;
        if ( pAn->D == SCL_INFINITY )
            *pAn = *pDn;
        //printf( "Using inverter to improve delay at node %d in phase %d.\n", iObj, 0 );
    }
    //assert( pAp->F < FLT_MAX || pAn->F < FLT_MAX );
    // try replacing pos with neg
    if ( pAp->D == SCL_INFINITY || (pAp->F > pAn->F + p->InvAreaF + NF_EPSILON && pAn->D + p->InvDelayI <= Required[0]) )
    {
        assert( p->Iter > 0 );
        *pAp = *pAn;
        pAp->D += p->InvDelayI;
        pAp->F += p->InvAreaF;
        pAp->fCompl = 1;
        if ( pDp->D == SCL_INFINITY )
            *pDp = *pAp;
        //printf( "Using inverter to improve area at node %d in phase %d.\n", iObj, 1 );
    }
    // try replacing neg with pos
    else if ( pAn->D == SCL_INFINITY || (pAn->F > pAp->F + p->InvAreaF + NF_EPSILON && pAp->D + p->InvDelayI <= Required[1]) )
    {
        assert( p->Iter > 0 );
        *pAn = *pAp;
        pAn->D += p->InvDelayI;
        pAn->F += p->InvAreaF;
        pAn->fCompl = 1;
        if ( pDn->D == SCL_INFINITY )
            *pDn = *pAn;
        //printf( "Using inverter to improve area at node %d in phase %d.\n", iObj, 0 );
    }

    if ( pDp->D == SCL_INFINITY )
        printf( "Object %d has pDp unassigned.\n", iObj );
    if ( pDn->D == SCL_INFINITY )
        printf( "Object %d has pDn unassigned.\n", iObj );
    if ( pAp->D == SCL_INFINITY )
        printf( "Object %d has pAp unassigned.\n", iObj );
    if ( pAn->D == SCL_INFINITY )
        printf( "Object %d has pAn unassigned.\n", iObj );
/*
    pDp->F = Abc_MinFloat( pDp->F, FLT_MAX/SCL_NUM );
    pDn->F = Abc_MinFloat( pDn->F, FLT_MAX/SCL_NUM );
    pAp->F = Abc_MinFloat( pAp->F, FLT_MAX/SCL_NUM );  
    pAn->F = Abc_MinFloat( pAn->F, FLT_MAX/SCL_NUM );
*/    
    assert( pDp->D < SCL_INFINITY );
    assert( pDn->D < SCL_INFINITY );
    assert( pAp->D < SCL_INFINITY );
    assert( pAn->D < SCL_INFINITY );

    assert( pDp->F < FLT_MAX );
    assert( pDn->F < FLT_MAX );
    assert( pAp->F < FLT_MAX );
    assert( pAn->F < FLT_MAX );

/*
    if ( p->Iter && (pDp->D > Required[0] || pDn->D > Required[1]) )
    {
        printf( "%5d : ", iObj );
        printf( "Dp = %6.2f  ", Scl_Int2Flt(pDp->D) );
        printf( "Dn = %6.2f  ", Scl_Int2Flt(pDn->D) );
        printf( "  " );
        printf( "Ap = %6.2f  ", Scl_Int2Flt(pAp->D) );
        printf( "An = %6.2f  ", Scl_Int2Flt(pAn->D) );
        printf( "  " );
        printf( "Rp = %6.2f  ", Scl_Int2Flt(Required[0]) );
        printf( "Rn = %6.2f  ", Scl_Int2Flt(Required[1]) );
        printf( "\n" );
    }
*/
}